

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# goeslrit.cc
# Opt level: O3

bool filter(Options *opts,
           unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *spdu)

{
  SessionPDU *pSVar1;
  long lVar2;
  runtime_error *this;
  NOAALRITHeader NVar3;
  PrimaryHeader ph;
  stringstream ss;
  string local_1e0 [32];
  PrimaryHeader local_1c0;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  pSVar1 = (spdu->_M_t).
           super___uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
           ._M_t.
           super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
           .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl;
  lrit::getHeader<lrit::PrimaryHeader>(&local_1c0,&pSVar1->buf_,&pSVar1->m_);
  pSVar1 = (spdu->_M_t).
           super___uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
           ._M_t.
           super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
           .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl;
  NVar3 = lrit::getHeader<lrit::NOAALRITHeader>(&pSVar1->buf_,&pSVar1->m_);
  if (local_1c0.fileType < 2) {
    lVar2 = 0x90;
    if ((string)local_1c0.fileType != (string)0x0) {
      if ((string)local_1c0.fileType != (string)0x1) {
LAB_001210ab:
        std::__cxx11::stringstream::stringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(local_198,"Invalid file type: ",0x13);
        local_1e0[0] = (string)local_1c0.fileType;
        std::__ostream_insert<char,std::char_traits<char>>(local_198,(char *)local_1e0,1);
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(this,local_1e0);
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      lVar2 = 0x91;
    }
  }
  else if ((string)local_1c0.fileType == (string)0x2) {
    lVar2 = 0x94;
    if (NVar3.productID != 9) {
      lVar2 = (ulong)(NVar3.productID == 6) * 2 + 0x92;
    }
  }
  else {
    if ((string)local_1c0.fileType != (string)0x82) goto LAB_001210ab;
    lVar2 = 0x93;
  }
  return (bool)(*(byte *)((long)&(opts->nanomsg)._M_dataplus._M_p + lVar2) ^ 1);
}

Assistant:

bool filter(const Options& opts, std::unique_ptr<assembler::SessionPDU>& spdu) {
  // Per http://www.noaasis.noaa.gov/LRIT/pdf-files/LRIT_receiver-specs.pdf,
  // Table 4, every file has a NOAA LRIT header.
  auto ph = spdu->getHeader<lrit::PrimaryHeader>();
  auto nlh = spdu->getHeader<lrit::NOAALRITHeader>();
  if (ph.fileType == 0) {
    return !opts.images;
  }
  if (ph.fileType == 1) {
    return !opts.messages;
  }
  if (ph.fileType == 2) {
    // This may be an EMWIN file.
    if (nlh.productID == 6 || nlh.productID == 9) {
      return !opts.emwin;
    }
    return !opts.text;
  }
  if (ph.fileType == 130) {
    return !opts.dcs;
  }

  std::stringstream ss;
  ss << "Invalid file type: " << ph.fileType;
  throw std::runtime_error(ss.str());
}